

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreEvaluators.h
# Opt level: O0

void __thiscall
Eigen::internal::
unary_evaluator<Eigen::Replicate<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1>,_Eigen::internal::IndexBased,_double>
::unary_evaluator(unary_evaluator<Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>,_Eigen::internal::IndexBased,_double>
                  *this,XprType *replicate)

{
  _MatrixTypeNested *p_Var1;
  Index IVar2;
  Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1> *in_RSI;
  undefined8 *in_RDI;
  XprType *in_stack_ffffffffffffff88;
  evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffffff90;
  
  evaluator_base<Eigen::Replicate<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1>_>::
  evaluator_base((evaluator_base<Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>
                  *)0x163a95);
  p_Var1 = Replicate<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1>::nestedExpression(in_RSI);
  *in_RDI = p_Var1;
  evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::evaluator
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  Replicate<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1>::nestedExpression(in_RSI);
  IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x163af7);
  variable_if_dynamic<long,_-1>::variable_if_dynamic
            ((variable_if_dynamic<long,__1> *)(in_RDI + 3),IVar2);
  Replicate<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1>::nestedExpression(in_RSI);
  IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x163b38);
  variable_if_dynamic<long,_-1>::variable_if_dynamic
            ((variable_if_dynamic<long,__1> *)(in_RDI + 4),IVar2);
  return;
}

Assistant:

unary_evaluator(const XprType& replicate)
    : m_arg(replicate.nestedExpression()),
      m_argImpl(m_arg),
      m_rows(replicate.nestedExpression().rows()),
      m_cols(replicate.nestedExpression().cols())
  {}